

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnIfExpr(BinaryReaderIR *this,Type sig_type)

{
  bool bVar1;
  pointer pIVar2;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_50;
  Enum local_44;
  ExprList *local_40;
  ExprList *expr_list;
  unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> local_28;
  unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> expr;
  Type sig_type_local;
  BinaryReaderIR *this_local;
  
  expr._M_t.super___uniq_ptr_impl<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::IfExpr_*,_std::default_delete<wabt::IfExpr>_>.
  super__Head_base<0UL,_wabt::IfExpr_*,_false>._M_head_impl._4_4_ = sig_type;
  MakeUnique<wabt::IfExpr>();
  pIVar2 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->(&local_28);
  SetBlockDeclaration(this,&(pIVar2->true_).decl,
                      expr._M_t.
                      super___uniq_ptr_impl<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>._M_t.
                      super__Tuple_impl<0UL,_wabt::IfExpr_*,_std::default_delete<wabt::IfExpr>_>.
                      super__Head_base<0UL,_wabt::IfExpr_*,_false>._M_head_impl._4_4_);
  pIVar2 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->(&local_28);
  local_40 = &(pIVar2->true_).exprs;
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::IfExpr,std::default_delete<wabt::IfExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_50,&local_28);
  local_44 = (Enum)AppendExpr(this,&local_50);
  bVar1 = Failed((Result)local_44);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_50);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    PushLabel(this,If,local_40,(Expr *)0x0);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::~unique_ptr(&local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnIfExpr(Type sig_type) {
  auto expr = MakeUnique<IfExpr>();
  SetBlockDeclaration(&expr->true_.decl, sig_type);
  ExprList* expr_list = &expr->true_.exprs;
  CHECK_RESULT(AppendExpr(std::move(expr)));
  PushLabel(LabelType::If, expr_list);
  return Result::Ok;
}